

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

void __thiscall Matrix<double>::initialize(Matrix<double> *this,double beg,double end)

{
  uint uVar1;
  int iVar2;
  time_t tVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  uVar1 = (this->m_shape).n_row;
  if (uVar1 != 0) {
    uVar4 = (ulong)(this->m_shape).n_col;
    uVar6 = 0;
    do {
      iVar2 = (int)uVar4;
      uVar4 = 0;
      if (iVar2 != 0) {
        uVar5 = 0;
        do {
          iVar2 = rand();
          *(double *)
           (*(long *)&(this->m_elems).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar6].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + uVar5 * 8) =
               ((double)iVar2 / 2147483647.0) * (end - beg) + beg;
          uVar5 = uVar5 + 1;
          uVar4 = (ulong)(this->m_shape).n_col;
        } while (uVar5 < uVar4);
        uVar1 = (this->m_shape).n_row;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar1);
  }
  return;
}

Assistant:

void Matrix<T>::initialize(T beg, T end){
    srand(time(0));

    for(unsigned i=0;i<m_shape.n_row;++i){
        for(unsigned j=0;j<m_shape.n_col;++j)
            m_elems[i][j]=get_random<T>(beg, end);
    }
}